

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

bool anon_unknown.dwarf_19cc1b5::FileHasArchitecture(char *filename,uint16_t machine)

{
  undefined2 uVar1;
  bool bVar2;
  uint16_t uVar3;
  bool local_69;
  undefined1 local_48 [8];
  cmELF elf;
  uint16_t machine_local;
  char *filename_local;
  
  elf.ErrorMessage.field_2._14_2_ = machine;
  cmELF::cmELF((cmELF *)local_48,filename);
  bVar2 = cmELF::operator_cast_to_bool((cmELF *)local_48);
  uVar1 = elf.ErrorMessage.field_2._14_2_;
  if (bVar2) {
    local_69 = true;
    if (elf.ErrorMessage.field_2._14_2_ != 0) {
      uVar3 = cmELF::GetMachine((cmELF *)local_48);
      local_69 = uVar1 == uVar3;
    }
    filename_local._7_1_ = local_69;
  }
  else {
    filename_local._7_1_ = false;
  }
  cmELF::~cmELF((cmELF *)local_48);
  return filename_local._7_1_;
}

Assistant:

bool FileHasArchitecture(const char* filename, std::uint16_t machine)
{
  cmELF elf(filename);
  if (!elf) {
    return false;
  }
  return machine == 0 || machine == elf.GetMachine();
}